

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
::clear_to_size(dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                *this,size_type new_num_buckets)

{
  void *__ptr;
  pointer ptr;
  ulong uVar1;
  size_type sVar2;
  long lVar3;
  DenseIntMap<int> *this_00;
  float fVar4;
  
  ptr = this->table;
  if (ptr == (pointer)0x0) {
    ptr = (pointer)malloc(new_num_buckets * 0x58);
  }
  else {
    sVar2 = this->num_buckets;
    if (sVar2 == 0) {
      sVar2 = 0;
    }
    else {
      lVar3 = 0x50;
      do {
        __ptr = *(void **)((long)&this->table->first + lVar3);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar3 = lVar3 + 0x58;
        sVar2 = sVar2 - 1;
      } while (sVar2 != 0);
      sVar2 = this->num_buckets;
      ptr = this->table;
    }
    if (sVar2 == new_num_buckets) goto LAB_00617899;
    ptr = alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
          ::realloc_or_die((alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                            *)&this->field_0x60,ptr,new_num_buckets);
  }
  this->table = ptr;
LAB_00617899:
  if (new_num_buckets != 0) {
    this_00 = &ptr->second;
    sVar2 = new_num_buckets;
    do {
      *(type *)((long)(this_00 + -1) + 0x48) = (this->key_info).empty_key;
      DenseIntMap<int>::DenseIntMap(this_00);
      this_00 = (DenseIntMap<int> *)((long)(this_00 + 1) + 8);
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar4 = (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)new_num_buckets;
  uVar1 = (ulong)fVar4;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
       (long)(fVar4 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1;
  fVar4 = (float)new_num_buckets *
          (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_
  ;
  uVar1 = (ulong)fVar4;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
       (long)(fVar4 - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }